

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Reference<std::allocator<absl::lts_20250127::LogSink_*>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>::
EmplaceBackSlow<absl::lts_20250127::LogSink*const&>
          (Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>
           *this,LogSink **args)

{
  allocator<absl::lts_20250127::LogSink_*> *paVar1;
  SizeType<std::allocator<absl::lts_20250127::LogSink_*>_> requested_capacity_00;
  Pointer<std::allocator<absl::lts_20250127::LogSink_*>_> ppLVar2;
  Pointer<std::allocator<absl::lts_20250127::LogSink_*>_> *pppLVar3;
  Allocation<std::allocator<absl::lts_20250127::LogSink_*>_> allocation;
  Pointer<std::allocator<absl::lts_20250127::LogSink_*>_> last_ptr;
  Pointer<std::allocator<absl::lts_20250127::LogSink_*>_> construct_data;
  SizeType<std::allocator<absl::lts_20250127::LogSink_*>_> requested_capacity;
  move_iterator<absl::lts_20250127::LogSink_**> local_50;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::LogSink_*>,_std::move_iterator<absl::lts_20250127::LogSink_**>_>
  local_48;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::LogSink_*>,_std::move_iterator<absl::lts_20250127::LogSink_**>_>
  move_values;
  AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_> allocation_tx;
  StorageView<std::allocator<absl::lts_20250127::LogSink_*>_> storage_view;
  LogSink **args_local;
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
  *this_local;
  
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  MakeStorageView((StorageView<std::allocator<absl::lts_20250127::LogSink_*>_> *)
                  &allocation_tx.capacity_,
                  (Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                   *)this);
  paVar1 = Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
           ::GetAllocator((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                           *)this);
  AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_>::AllocationTransaction
            ((AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_> *)&move_values,
             paVar1);
  std::move_iterator<absl::lts_20250127::LogSink_**>::move_iterator
            (&local_50,(iterator_type)allocation_tx.capacity_);
  IteratorValueAdapter<std::allocator<absl::lts_20250127::LogSink_*>,_std::move_iterator<absl::lts_20250127::LogSink_**>_>
  ::IteratorValueAdapter(&local_48,&local_50);
  requested_capacity_00 =
       Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
       ::NextCapacity(storage_view.size);
  ppLVar2 = AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_>::Allocate
                      ((AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_> *)
                       &move_values,requested_capacity_00);
  paVar1 = Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
           ::GetAllocator((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                           *)this);
  std::allocator_traits<std::allocator<absl::lts_20250127::LogSink*>>::
  construct<absl::lts_20250127::LogSink*,absl::lts_20250127::LogSink*const&>
            (paVar1,ppLVar2 + (long)storage_view.data,args);
  paVar1 = Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
           ::GetAllocator((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                           *)this);
  pppLVar3 = AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_>::GetData
                       ((AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_> *)
                        &move_values);
  ConstructElements<std::allocator<absl::lts_20250127::LogSink*>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::LogSink*>,std::move_iterator<absl::lts_20250127::LogSink**>>>
            (paVar1,*pppLVar3,&local_48,
             (SizeType<std::allocator<absl::lts_20250127::LogSink_*>_>)storage_view.data);
  paVar1 = Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
           ::GetAllocator((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                           *)this);
  DestroyAdapter<std::allocator<absl::lts_20250127::LogSink_*>,_true>::DestroyElements
            (paVar1,(Pointer<std::allocator<absl::lts_20250127::LogSink_*>_>)allocation_tx.capacity_
             ,(SizeType<std::allocator<absl::lts_20250127::LogSink_*>_>)storage_view.data);
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  DeallocateIfAllocated
            ((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
              *)this);
  allocation = AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_>::Release
                         ((AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_> *)
                          &move_values);
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  SetAllocation((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                 *)this,allocation);
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  SetIsAllocated((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
                  *)this);
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  AddSize((Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
           *)this,1);
  AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_>::~AllocationTransaction
            ((AllocationTransaction<std::allocator<absl::lts_20250127::LogSink_*>_> *)&move_values);
  return ppLVar2 + (long)storage_view.data;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }